

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astFunctionSignature *
new_function_signature
          (Context_conflict *ctx,MOJOSHADER_astDataType *dt,char *identifier,
          MOJOSHADER_astFunctionParameters *params)

{
  MOJOSHADER_astFunctionSignature *pMVar1;
  
  pMVar1 = (MOJOSHADER_astFunctionSignature *)(*ctx->malloc)(0x40,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_astFunctionSignature *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar1 = (MOJOSHADER_astFunctionSignature *)0x0;
  }
  else {
    (pMVar1->ast).type = MOJOSHADER_AST_FUNCTION_SIGNATURE;
    (pMVar1->ast).filename = ctx->sourcefile;
    (pMVar1->ast).line = ctx->sourceline;
    pMVar1->datatype = dt;
    pMVar1->identifier = identifier;
    pMVar1->params = params;
    pMVar1->storage_class = MOJOSHADER_AST_FNSTORECLS_NONE;
    pMVar1->semantic = (char *)0x0;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_astFunctionSignature *new_function_signature(Context *ctx,
                                    const MOJOSHADER_astDataType *dt,
                                    const char *identifier,
                                    MOJOSHADER_astFunctionParameters *params)
{
    NEW_AST_NODE(retval, MOJOSHADER_astFunctionSignature,
                 MOJOSHADER_AST_FUNCTION_SIGNATURE);
    retval->datatype = dt;
    retval->identifier = identifier;
    retval->params = params;
    retval->storage_class = MOJOSHADER_AST_FNSTORECLS_NONE;
    retval->semantic = NULL;
    return retval;
}